

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constexpr_parser.h
# Opt level: O2

int absl::lts_20250127::str_format_internal::ParseDigits(char *c,char **pos,char *end)

{
  char cVar1;
  char *pcVar2;
  int iVar3;
  int iVar4;
  
  iVar3 = (int)*c;
  iVar4 = -8;
  while( true ) {
    iVar3 = iVar3 + -0x30;
    pcVar2 = *pos;
    if (pcVar2 == end) {
      return iVar3;
    }
    *pos = pcVar2 + 1;
    cVar1 = *pcVar2;
    *c = cVar1;
    if ((byte)(cVar1 - 0x3aU) < 0xf6) break;
    if (iVar4 == 0) {
      return iVar3;
    }
    iVar3 = iVar3 * 10 + (int)cVar1;
    iVar4 = iVar4 + 1;
  }
  return iVar3;
}

Assistant:

constexpr int ParseDigits(char& c, const char*& pos, const char* const end) {
  int digits = c - '0';
  // We do not want to overflow `digits` so we consume at most digits10
  // digits. If there are more digits the parsing will fail later on when the
  // digit doesn't match the expected characters.
  int num_digits = std::numeric_limits<int>::digits10;
  for (;;) {
    if (ABSL_PREDICT_FALSE(pos == end)) break;
    c = *pos++;
    if ('0' > c || c > '9') break;
    --num_digits;
    if (ABSL_PREDICT_FALSE(!num_digits)) break;
    digits = 10 * digits + c - '0';
  }
  return digits;
}